

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O0

LiteralSelector *
Kernel::LiteralSelector::getSelector(Ordering *ordering,Options *options,int selectorNumber)

{
  int iVar1;
  char *msg;
  int in_EDX;
  LiteralSelector *res;
  int absNum;
  undefined8 in_stack_ffffffffffffff48;
  Values value;
  Options *in_stack_ffffffffffffff50;
  Ordering *in_stack_ffffffffffffff58;
  Options *in_stack_ffffffffffffff60;
  Options *in_stack_ffffffffffffff68;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 completeSelection;
  LookaheadLiteralSelector *in_stack_ffffffffffffff80;
  Options *local_20;
  
  completeSelection = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  value = (Values)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar1 = in_EDX;
  if (in_EDX < 1) {
    iVar1 = -in_EDX;
  }
  if (iVar1 == 0) {
    local_20 = (Options *)::operator_new(0x20);
    TotalLiteralSelector::TotalLiteralSelector
              ((TotalLiteralSelector *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
  }
  else if (iVar1 == 1) {
    local_20 = (Options *)::operator_new(0x20);
    MaximalLiteralSelector::MaximalLiteralSelector
              ((MaximalLiteralSelector *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50);
  }
  else if (iVar1 == 2) {
    local_20 = (Options *)::operator_new(0x70);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
    ::CompleteBestLiteralSelector
              ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
                *)in_stack_ffffffffffffff70,(Ordering *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 3) {
    local_20 = (Options *)::operator_new(0xb0);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
    ::CompleteBestLiteralSelector
              ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                *)in_stack_ffffffffffffff70,(Ordering *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 4) {
    local_20 = (Options *)::operator_new(0xd0);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
    ::CompleteBestLiteralSelector
              (in_stack_ffffffffffffff70,(Ordering *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 10) {
    local_20 = (Options *)::operator_new(0xb0);
    CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
    ::CompleteBestLiteralSelector
              ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                *)in_stack_ffffffffffffff70,(Ordering *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 0xb) {
    local_20 = (Options *)::operator_new(0x30);
    LookaheadLiteralSelector::LookaheadLiteralSelector
              (in_stack_ffffffffffffff80,(bool)completeSelection,
               (Ordering *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if (iVar1 - 0x14U < 3) {
    local_20 = (Options *)::operator_new(0x20);
    SpassLiteralSelector::SpassLiteralSelector
              ((SpassLiteralSelector *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,value);
  }
  else if (iVar1 - 0x1eU < 6) {
    local_20 = (Options *)::operator_new(0x20);
    ELiteralSelector::ELiteralSelector
              ((ELiteralSelector *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,value);
  }
  else if (iVar1 == 0x29a) {
    local_20 = (Options *)::operator_new(0x20);
    RndLiteralSelector::RndLiteralSelector
              ((RndLiteralSelector *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  }
  else if (iVar1 == 0x3ea) {
    local_20 = (Options *)::operator_new(0x70);
    BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
    ::BestLiteralSelector
              ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
                *)in_stack_ffffffffffffff70,(Ordering *)in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 0x3eb) {
    local_20 = (Options *)::operator_new(0xb0);
    BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
    ::BestLiteralSelector
              ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastDistinctVariables,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                *)local_20,(Ordering *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 0x3ec) {
    local_20 = (Options *)::operator_new(0xd0);
    BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
    ::BestLiteralSelector
              ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NoPositiveEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastTopLevelVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::LeastVariables,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>_>_>_>
                *)in_stack_ffffffffffffff70,(Ordering *)local_20,in_stack_ffffffffffffff60);
  }
  else if (iVar1 == 0x3f2) {
    local_20 = (Options *)::operator_new(0xb0);
    BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
    ::BestLiteralSelector
              ((BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
                *)in_stack_ffffffffffffff70,(Ordering *)in_stack_ffffffffffffff68,local_20);
  }
  else if (iVar1 == 0x3f3) {
    local_20 = (Options *)::operator_new(0x30);
    LookaheadLiteralSelector::LookaheadLiteralSelector
              (in_stack_ffffffffffffff80,(bool)completeSelection,
               (Ordering *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    if (iVar1 != 0x682) {
      msg = (char *)__cxa_allocate_exception(0x28);
      Lib::InvalidOperationException::InvalidOperationException
                ((InvalidOperationException *)in_stack_ffffffffffffff50,msg);
      __cxa_throw(msg,&Lib::InvalidOperationException::typeinfo,
                  Lib::InvalidOperationException::~InvalidOperationException);
    }
    local_20 = (Options *)::operator_new(0x20);
    RndLiteralSelector::RndLiteralSelector
              ((RndLiteralSelector *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,local_20,
               SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  }
  if (in_EDX < 0) {
    (*(*(_func_int ***)&(local_20->_lookup)._longMap)[3])(local_20,1);
  }
  return (LiteralSelector *)local_20;
}

Assistant:

LiteralSelector* LiteralSelector::getSelector(const Ordering& ordering, const Options& options, int selectorNumber)
{
  using namespace LiteralComparators;

  typedef Composite<ColoredFirst,
	    Composite<MaximalSize,
	    LexComparator> > Comparator2;

  typedef Composite<ColoredFirst,
	    Composite<NoPositiveEquality,
	    Composite<LeastTopLevelVariables,
	    Composite<LeastDistinctVariables, LexComparator> > > > Comparator3;

  typedef Composite<ColoredFirst,
	    Composite<NoPositiveEquality,
	    Composite<LeastTopLevelVariables,
	    Composite<LeastVariables,
	    Composite<MaximalSize, LexComparator> > > > > Comparator4;

  typedef Composite<ColoredFirst,
	    Composite<NegativeEquality,
	    Composite<MaximalSize,
	    Composite<Negative, LexComparator> > > > Comparator10;

  int absNum = abs(selectorNumber);

  LiteralSelector* res;
  switch(absNum) {
  case 0: res = new TotalLiteralSelector(ordering, options); break;
  case 1: res = new MaximalLiteralSelector(ordering, options); break;
  case 2: res = new CompleteBestLiteralSelector<Comparator2>(ordering, options); break;
  case 3: res = new CompleteBestLiteralSelector<Comparator3>(ordering, options); break;
  case 4: res = new CompleteBestLiteralSelector<Comparator4>(ordering, options); break;
  case 10: res = new CompleteBestLiteralSelector<Comparator10>(ordering, options); break;

  case 11: res = new LookaheadLiteralSelector(true, ordering, options); break;

  case 20:
  case 21:
  case 22:
    res = new SpassLiteralSelector(ordering, options,static_cast<SpassLiteralSelector::Values>(absNum-20));
    break;

  case 30:
  case 31:
  case 32:
  case 33:
  case 34:
  case 35:
    res = new ELiteralSelector(ordering, options,static_cast<ELiteralSelector::Values>(absNum-30));
    break;

  case 666: res = new RndLiteralSelector(ordering, options,true /*complete*/); break;

  case 1002: res = new BestLiteralSelector<Comparator2>(ordering, options); break;
  case 1003: res = new BestLiteralSelector<Comparator3>(ordering, options); break;
  case 1004: res = new BestLiteralSelector<Comparator4>(ordering, options); break;
  case 1010: res = new BestLiteralSelector<Comparator10>(ordering, options); break;
  case 1011: res = new LookaheadLiteralSelector(false, ordering, options); break;
  case 1666: res = new RndLiteralSelector(ordering, options,false /*incomplete*/); break;

  default:
    INVALID_OPERATION("Undefined selection function");
  }
  if(selectorNumber<0) {
    res->setReversePolarity(true);
  }
  return res;
}